

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTopKLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ActivationLinear *pAVar3;
  string *psVar4;
  pointer pcVar5;
  NeuralNetworkLayer *pNVar6;
  bool bVar7;
  LogMessage *pLVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  LayerUnion LVar11;
  long lVar12;
  long *plVar13;
  size_type *psVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  _Rb_tree_header *p_Var17;
  Result r;
  string err;
  string err_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [40];
  string local_198;
  NeuralNetworkLayer *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  Result::Result((Result *)&local_1f8);
  validateInputCount((Result *)local_1d0,layer,1,2);
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0;
  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1c8);
  bVar7 = Result::good((Result *)&local_1f8);
  pcVar5 = local_1c0 + 8;
  if (local_1c8._M_p != pcVar5) {
    operator_delete(local_1c8._M_p,local_1c0._8_8_ + 1);
  }
  if (bVar7) {
    local_178 = layer;
    validateOutputCount((Result *)local_1d0,layer,2,2);
    local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0;
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1c8);
    bVar7 = Result::good((Result *)&local_1f8);
    if (local_1c8._M_p != pcVar5) {
      operator_delete(local_1c8._M_p,local_1c0._8_8_ + 1);
    }
    if (bVar7) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"TopK","");
      this_00 = &this->blobNameToRank;
      validateInputOutputRankEquality((Result *)local_1d0,local_178,&local_150,this_00);
      local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0;
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1c8);
      bVar7 = Result::good((Result *)&local_1f8);
      if (local_1c8._M_p != pcVar5) {
        operator_delete(local_1c8._M_p,local_1c0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      pNVar6 = local_178;
      if (bVar7) {
        if ((local_178->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar8 = google::protobuf::internal::LogMessage::operator<<
                             (&local_110,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1d0,pLVar8);
          google::protobuf::internal::LogMessage::~LogMessage(&local_110);
        }
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((pNVar6->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var17 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar9._M_node == p_Var17) {
LAB_002e9d49:
          if (0 < (pNVar6->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            if (pNVar6->_oneof_case_[0] == 0x3f7) {
              LVar11 = pNVar6->layer_;
            }
            else {
              LVar11.topk_ = Specification::TopKLayerParams::default_instance();
            }
            if ((pNVar6->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_1d0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x5ca);
              pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                 ((LogMessage *)local_1d0,
                                  "CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_198,pLVar8);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1d0);
            }
            lVar12 = (long)*(int *)((long)((pNVar6->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                          elements[0] + 0x24);
            pAVar3 = ((LVar11.activation_)->NonlinearityType_).linear_;
            if ((SBORROW8((long)pAVar3,-lVar12) !=
                 (long)&(pAVar3->super_MessageLite)._vptr_MessageLite + lVar12 < 0) ||
               (lVar12 <= (long)pAVar3)) {
              std::operator+(&local_170,
                             "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                             ,(pNVar6->name_).ptr_);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_170);
              psVar14 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_198.field_2._M_allocated_capacity = *psVar14;
                local_198.field_2._8_8_ = plVar13[3];
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              }
              else {
                local_198.field_2._M_allocated_capacity = *psVar14;
                local_198._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_198._M_string_length = plVar13[1];
              *plVar13 = (long)psVar14;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_198);
              uVar15 = local_198.field_2._M_allocated_capacity;
              _Var16._M_p = local_198._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_002e9dbf;
              goto LAB_002ea072;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
        else {
          if ((pNVar6->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               (&local_d8,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1d0,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
          }
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&this_00->_M_t,
                         *(key_type **)((pNVar6->output_).super_RepeatedPtrFieldBase.rep_ + 1));
          if ((_Rb_tree_header *)iVar9._M_node == p_Var17) goto LAB_002e9d49;
          if ((pNVar6->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               (&local_a0,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1d0,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
          }
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_00,(key_type *)
                                 ((pNVar6->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
          iVar2 = *pmVar10;
          if ((pNVar6->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               (&local_68,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1d0,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage(&local_68);
          }
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_00,*(key_type **)
                                  ((pNVar6->output_).super_RepeatedPtrFieldBase.rep_ + 1));
          if (iVar2 == *pmVar10) goto LAB_002e9d49;
          local_1c8._M_p = (pointer)0x0;
          local_1c0[0] = '\0';
          psVar4 = (pNVar6->name_).ptr_;
          pcVar5 = (psVar4->_M_dataplus)._M_p;
          local_1d0 = (undefined1  [8])local_1c0;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar5,pcVar5 + psVar4->_M_string_length);
          std::operator+(&local_170,"Layer \'",&local_130);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_170);
          psVar14 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_198.field_2._M_allocated_capacity = *psVar14;
            local_198.field_2._8_8_ = plVar13[3];
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar14;
            local_198._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_198._M_string_length = plVar13[1];
          *plVar13 = (long)psVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1d0);
          if (local_1d0 == (undefined1  [8])local_1c0) goto LAB_002e9dbf;
          uVar15 = CONCAT71(local_1c0._1_7_,local_1c0[0]);
          _Var16._M_p = (pointer)local_1d0;
LAB_002ea072:
          operator_delete(_Var16._M_p,uVar15 + 1);
        }
        goto LAB_002e9dbf;
      }
    }
  }
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_1f8;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p == &local_1e0) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_1e0._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_1f0._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_1e8;
  local_1e8 = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_1f0._M_p = (pointer)&local_1e0;
LAB_002e9dbf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p,
                    CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTopKLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 2)).good()) return r;
    if (!(r = validateOutputCount(layer, 2, 2)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "TopK", blobNameToRank)).good()) return r;

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(1)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(1))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type 'TopK' expects equal ranks for its input and second output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.topk();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}